

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeSetDefaultArrival(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  int iVar1;
  uint ObjId;
  Abc_ManTime_t *pAVar2;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  float Fall_local;
  float Rise_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar2 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar2;
  }
  (pNtk->pManTime->tArrDef).Rise = Rise;
  (pNtk->pManTime->tArrDef).Fall = Fall;
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkCi(pNtk,local_24);
    ObjId = Abc_ObjId(pObj_00);
    Abc_NtkTimeSetArrival(pNtk,ObjId,Rise,Fall);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultArrival( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
    Abc_Obj_t * pObj; int i;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tArrDef.Rise  = Rise;
    pNtk->pManTime->tArrDef.Fall  = Fall;
    // set the arrival times for each input
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NtkTimeSetArrival( pNtk, Abc_ObjId(pObj), Rise, Fall );    
}